

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  int *piVar1;
  char *pcVar2;
  void *pvVar3;
  ImFont **ppIVar4;
  ImFont *pIVar5;
  ImFontConfig *pIVar6;
  ImGuiContext *pIVar7;
  uint uVar8;
  ulong uVar9;
  ImFontConfig *pIVar10;
  long lVar11;
  long lVar12;
  
  uVar8 = (this->ConfigData).Size;
  uVar9 = (ulong)uVar8;
  if (0 < (int)uVar8) {
    pIVar10 = (this->ConfigData).Data;
    lVar11 = 0;
    lVar12 = 0;
    do {
      pIVar7 = GImGui;
      pvVar3 = *(void **)(pIVar10->Name + lVar11 + -0x3a);
      if ((pvVar3 != (void *)0x0) && (pIVar10->Name[lVar11 + -0x2e] == '\x01')) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
        (*(pIVar7->IO).MemFreeFn)(pvVar3);
        uVar9 = (ulong)(this->ConfigData).Size;
        if ((long)uVar9 <= lVar12) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,
                        "value_type &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]");
        }
        pIVar10 = (this->ConfigData).Data;
        pcVar2 = pIVar10->Name + lVar11 + -0x3a;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
      }
      lVar12 = lVar12 + 1;
      uVar8 = (uint)uVar9;
      lVar11 = lVar11 + 0x68;
    } while (lVar12 < (int)uVar8);
  }
  lVar11 = (long)(this->Fonts).Size;
  if (lVar11 < 1) {
    pIVar10 = (this->ConfigData).Data;
  }
  else {
    ppIVar4 = (this->Fonts).Data;
    pIVar10 = (this->ConfigData).Data;
    lVar12 = 0;
    do {
      pIVar5 = ppIVar4[lVar12];
      pIVar6 = pIVar5->ConfigData;
      if ((pIVar10 <= pIVar6) && (pIVar6 < pIVar10 + (int)uVar8)) {
        pIVar5->ConfigData = (ImFontConfig *)0x0;
        ppIVar4[lVar12]->ConfigDataCount = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 != lVar12);
  }
  if (pIVar10 != (ImFontConfig *)0x0) {
    (this->ConfigData).Size = 0;
    pIVar7 = GImGui;
    (this->ConfigData).Capacity = 0;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar7->IO).MemFreeFn)(pIVar10);
    (this->ConfigData).Data = (ImFontConfig *)0x0;
  }
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            ImGui::MemFree(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
}